

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.h
# Opt level: O1

LPUTF8 utf8::EncodeSurrogatePair<false>(char16 surrogateHigh,char16 surrogateLow,LPUTF8 ptr)

{
  uint uVar1;
  undefined2 in_register_00000032;
  undefined6 in_register_0000003a;
  uint uVar2;
  
  uVar2 = (int)CONCAT62(in_register_0000003a,surrogateHigh) * 0x400 + 0xfca00000U |
          CONCAT22(in_register_00000032,surrogateLow) - 0xdc00U;
  uVar1 = uVar2 + 0x10000;
  CodexAssert(uVar1 < 0x110000);
  *ptr = (byte)(uVar1 >> 0x12) | 0xf0;
  ptr[1] = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
  ptr[2] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
  ptr[3] = (byte)surrogateLow & 0x3f | 0x80;
  return ptr + 4;
}

Assistant:

LPUTF8 EncodeSurrogatePair(char16 surrogateHigh, char16 surrogateLow, __out_ecount(4) LPUTF8 ptr)
    {
        // A unicode codepoint is encoded into a surrogate pair by doing the following:
        //  subtract 0x10000 from the codepoint
        //  Split the resulting value into the high-ten bits and low-ten bits
        //  Add 0xD800 to the high ten bits, and 0xDC00 to the low ten bits
        // Below, we want to decode the surrogate pair to its original codepoint
        // So we do the above process in reverse
        uint32 highTen = (surrogateHigh - 0xD800);
        uint32 lowTen = (surrogateLow - 0xDC00);
        uint32 codepoint = 0x10000 + ((highTen << 10) | lowTen);

        // This is the maximum valid unicode codepoint
        // This should be ensured anyway since you can't encode a value higher
        // than this as a surrogate pair, so we assert this here
        CodexAssert(codepoint <= 0x10FFFF);

        // Now we need to encode the code point into utf-8
        // Codepoints in the range that gets encoded into a surrogate pair
        // gets encoded into 4 bytes under utf8
        // Since the codepoint can be represented by 21 bits, the encoding
        // does the following: first 3 bits in the first byte, the next 6 in the
        // second, the next six in the third, and the last six in the 4th byte
        if (countBytesOnly) {
            ptr += 4;
        }
        else
        {
            *ptr++ = static_cast<utf8char_t>(codepoint >> 18) | 0xF0;
            *ptr++ = static_cast<utf8char_t>((codepoint >> 12) & 0x3F) | 0x80;
            *ptr++ = static_cast<utf8char_t>((codepoint >> 6) & 0x3F) | 0x80;
            *ptr++ = static_cast<utf8char_t>(codepoint & 0x3F) | 0x80;
        }

        return ptr;
    }